

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD3Importer::ReadSkin(MD3Importer *this,SkinData *fill)

{
  long lVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string skin_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar2 = (char)&this->filename;
  lVar1 = std::__cxx11::string::rfind(cVar2,0x5f);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::rfind(cVar2,0x2e);
    if ((lVar1 == -1) && ((this->filename)._M_string_length == 0xffffffffffffffff)) {
      __assert_fail("s != std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD3/MD3Loader.cpp"
                    ,0x1f2,"void Assimp::MD3Importer::ReadSkin(Q3Shader::SkinData &) const");
    }
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->filename);
  std::operator+(&bStack_c8,&this->path,&local_48);
  std::operator+(&local_a8,&bStack_c8,"_");
  std::operator+(&local_88,&local_a8,&this->configSkinFile);
  std::operator+(&skin_file,&local_88,".skin");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_48);
  Q3Shader::LoadSkin(fill,&skin_file,this->mIOHandler);
  std::__cxx11::string::~string((string *)&skin_file);
  return;
}

Assistant:

void MD3Importer::ReadSkin(Q3Shader::SkinData& fill) const
{
    // skip any postfixes (e.g. lower_1.md3)
    std::string::size_type s = filename.find_last_of('_');
    if (s == std::string::npos) {
        s = filename.find_last_of('.');
        if (s == std::string::npos) {
            s = filename.size();
        }
    }
    ai_assert(s != std::string::npos);

    const std::string skin_file = path + filename.substr(0,s) + "_" + configSkinFile + ".skin";
    Q3Shader::LoadSkin(fill,skin_file,mIOHandler);
}